

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

void free_symtbl(symtbl_t *s)

{
  ulong uVar1;
  
  if (s->children != (symtbl_t **)0x0) {
    for (uVar1 = 0; uVar1 < s->num_children; uVar1 = uVar1 + 1) {
      free_symtbl(s->children[uVar1]);
    }
    free(s->children);
  }
  if (s->syms != (sym_t **)0x0) {
    for (uVar1 = 0; uVar1 < s->num_syms; uVar1 = uVar1 + 1) {
      free(s->syms[uVar1]);
    }
    free(s->syms);
  }
  free(s);
  return;
}

Assistant:

void free_symtbl(symtbl_t* s)
{
    unsigned int i;
    if (s->children)
    {
        for (i = 0; i < s->num_children; i++)
            free_symtbl(s->children[i]);
        free (s->children);
    }

    if (s->syms)
    {
        for (i = 0; i < s->num_syms; i++)
            free(s->syms[i]);
        free(s->syms);
    }

    free(s);
}